

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtexthtmlparser.cpp
# Opt level: O1

void __thiscall QTextHtmlParser::parseTag(QTextHtmlParser *this)

{
  char16_t cVar1;
  int iVar2;
  char16_t *pcVar3;
  QStringView element;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  bool bVar7;
  char cVar8;
  iterator iVar9;
  QTextHtmlParserNode *pQVar10;
  QTextHtmlElement *pQVar11;
  int iVar12;
  int iVar13;
  wchar32 wVar14;
  long lVar15;
  long in_FS_OFFSET;
  StyleSheet sheet;
  Parser parser;
  Data *in_stack_fffffffffffffef8;
  QArrayData *pQVar16;
  StyleRule *pSStack_100;
  qsizetype local_f8;
  QArrayDataPointer<QCss::MediaRule> local_f0;
  QArrayDataPointer<QCss::PageRule> local_d8;
  QArrayDataPointer<QCss::AnimationRule> local_c0;
  QArrayDataPointer<QCss::ImportRule> local_a8;
  StyleSheetOrigin local_90;
  QMultiHash<QString,_QCss::StyleRule> local_88;
  QMultiHash<QString,_QCss::StyleRule> local_78;
  undefined1 local_68 [32];
  undefined1 *local_48;
  QArrayData *pQStack_40;
  char16_t *local_38;
  undefined1 *puStack_30;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  eatSpace(this);
  iVar13 = this->pos;
  if (iVar13 < this->len) {
    if ((this->txt).d.ptr[iVar13] == L'!') {
      parseExclamationTag(this);
      iVar9 = QList<QTextHtmlParserNode_*>::end(&this->nodes);
      if (((iVar9.i[-1]->wsm != WhiteSpacePre) &&
          (iVar9 = QList<QTextHtmlParserNode_*>::end(&this->nodes),
          iVar9.i[-1]->wsm != WhiteSpacePreWrap)) && (this->textEditMode == false)) {
        if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
          eatSpace(this);
          return;
        }
        goto LAB_0051aba5;
      }
    }
    else {
      if ((this->len <= iVar13) || ((this->txt).d.ptr[iVar13] != L'/')) goto LAB_0051a86a;
      iVar9 = QList<QTextHtmlParserNode_*>::end(&this->nodes);
      if (iVar9.i[-1]->id == Html_style) {
        local_38 = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
        puStack_30 = &DAT_aaaaaaaaaaaaaaaa;
        local_48 = &DAT_aaaaaaaaaaaaaaaa;
        pQStack_40 = (QArrayData *)&DAT_aaaaaaaaaaaaaaaa;
        local_68._16_8_ = &DAT_aaaaaaaaaaaaaaaa;
        local_68._24_8_ = &DAT_aaaaaaaaaaaaaaaa;
        local_68._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
        local_68._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
        QCss::Parser::Parser
                  ((Parser *)local_68,&(this->nodes).d.ptr[(this->nodes).d.size + -1]->text,false);
        memset(&stack0xfffffffffffffef8,0xaa,0xa0);
        memset(&stack0xfffffffffffffef8,0,0xa0);
        local_90 = StyleSheetOrigin_Author;
        QCss::Parser::parse((Parser *)local_68,(StyleSheet *)&stack0xfffffffffffffef8,
                            CaseInsensitive);
        QtPrivate::QMovableArrayOps<QCss::StyleSheet>::emplace<QCss::StyleSheet_const&>
                  ((QMovableArrayOps<QCss::StyleSheet> *)&this->inlineStyleSheets,
                   (this->inlineStyleSheets).d.size,(StyleSheet *)&stack0xfffffffffffffef8);
        QList<QCss::StyleSheet>::end(&this->inlineStyleSheets);
        resolveStyleSheetImports(this,(StyleSheet *)&stack0xfffffffffffffef8);
        QMultiHash<QString,_QCss::StyleRule>::~QMultiHash(&local_78);
        QMultiHash<QString,_QCss::StyleRule>::~QMultiHash(&local_88);
        QArrayDataPointer<QCss::ImportRule>::~QArrayDataPointer(&local_a8);
        QArrayDataPointer<QCss::AnimationRule>::~QArrayDataPointer(&local_c0);
        QArrayDataPointer<QCss::PageRule>::~QArrayDataPointer(&local_d8);
        QArrayDataPointer<QCss::MediaRule>::~QArrayDataPointer(&local_f0);
        QArrayDataPointer<QCss::StyleRule>::~QArrayDataPointer
                  ((QArrayDataPointer<QCss::StyleRule> *)&stack0xfffffffffffffef8);
        if (pQStack_40 != (QArrayData *)0x0) {
          LOCK();
          (pQStack_40->ref_)._q_value.super___atomic_base<int>._M_i =
               (pQStack_40->ref_)._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if ((pQStack_40->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate(pQStack_40,2,0x10);
          }
        }
        QArrayDataPointer<QCss::Symbol>::~QArrayDataPointer
                  ((QArrayDataPointer<QCss::Symbol> *)local_68);
      }
      parseCloseTag(this);
    }
  }
  else {
LAB_0051a86a:
    iVar13 = (int)(this->nodes).d.size + -1;
    if (iVar13 != 0) {
      do {
        pQVar10 = (this->nodes).d.ptr[iVar13];
        if ((pQVar10->tag).d.size != 0) break;
        iVar13 = pQVar10->parent;
      } while (iVar13 != 0);
    }
    pQVar10 = newNode(this,iVar13);
    parseWord((QString *)local_68,this);
    QString::toLower_helper((QString *)&stack0xfffffffffffffef8);
    pQVar16 = &((pQVar10->tag).d.d)->super_QArrayData;
    (pQVar10->tag).d.d = in_stack_fffffffffffffef8;
    (pQVar10->tag).d.ptr = (char16_t *)pSStack_100;
    (pQVar10->tag).d.size = local_f8;
    if (pQVar16 != (QArrayData *)0x0) {
      LOCK();
      (pQVar16->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar16->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((pQVar16->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(pQVar16,2,0x10);
      }
    }
    if ((QArrayData *)local_68._0_8_ != (QArrayData *)0x0) {
      LOCK();
      (((QBasicAtomicInt *)local_68._0_8_)->_q_value).super___atomic_base<int>._M_i =
           (((QBasicAtomicInt *)local_68._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((((QBasicAtomicInt *)local_68._0_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate((QArrayData *)local_68._0_8_,2,0x10);
      }
    }
    element.m_data = (storage_type_conflict *)pQVar16;
    element.m_size = 0x51a93b;
    pQVar11 = lookupElementHelper(element);
    if (pQVar11 == (QTextHtmlElement *)0x0) {
      pQVar10->id = Html_unknown;
    }
    else {
      pQVar10->id = pQVar11->id;
      *(ushort *)&pQVar10->field_0x90 =
           (ushort)*(undefined4 *)&pQVar10->field_0x90 & 0xf1ff |
           (ushort)((pQVar11->displayMode & 7) << 9);
    }
    QList<QString>::clear(&pQVar10->attributes);
    if ((this->pos < this->len) &&
       (((cVar1 = (this->txt).d.ptr[this->pos], (ushort)cVar1 - 9 < 5 || (cVar1 == L' ')) ||
        ((0x7f < (ushort)cVar1 &&
         (((wVar14 = (wchar32)(ushort)cVar1, wVar14 == L'\x85' || (wVar14 == L'\xa0')) ||
          (cVar8 = QChar::isSpace_helper(wVar14), cVar8 != '\0')))))))) {
      parseAttributes((QStringList *)local_68,this);
      uVar6 = local_68._16_8_;
      uVar5 = local_68._8_8_;
      uVar4 = local_68._0_8_;
      local_68._0_8_ = (QArrayData *)0x0;
      local_68._8_8_ = (Symbol *)0x0;
      local_68._16_8_ = (undefined1 *)0x0;
      (pQVar10->attributes).d.d = (Data *)uVar4;
      (pQVar10->attributes).d.ptr = (QString *)uVar5;
      (pQVar10->attributes).d.size = uVar6;
      QArrayDataPointer<QString>::~QArrayDataPointer
                ((QArrayDataPointer<QString> *)&stack0xfffffffffffffef8);
      QArrayDataPointer<QString>::~QArrayDataPointer((QArrayDataPointer<QString> *)local_68);
    }
    pQVar10 = resolveParent(this);
    iVar9 = QList<QTextHtmlParserNode_*>::end(&this->nodes);
    QTextHtmlParserNode::initializeProperties
              (iVar9.i[-1],(this->nodes).d.ptr[iVar9.i[-1]->parent],this);
    declarationsForNode((QList<QCss::Declaration> *)&stack0xfffffffffffffef8,this,
                        (int)(this->nodes).d.size + -1);
    QTextHtmlParserNode::applyCssDeclarations
              (pQVar10,(QList<QCss::Declaration> *)&stack0xfffffffffffffef8,this->resourceProvider);
    QArrayDataPointer<QCss::Declaration>::~QArrayDataPointer
              ((QArrayDataPointer<QCss::Declaration> *)&stack0xfffffffffffffef8);
    applyAttributes(this,&pQVar10->attributes);
    iVar13 = this->pos;
    iVar2 = this->len;
    if (iVar13 < iVar2) {
      lVar15 = (long)iVar13;
      pcVar3 = (this->txt).d.ptr;
      bVar7 = false;
      do {
        cVar1 = pcVar3[lVar15];
        iVar12 = iVar13;
        if (cVar1 == L'>') break;
        if (cVar1 == L'/') {
          bVar7 = true;
        }
        lVar15 = lVar15 + 1;
        iVar13 = iVar13 + 1;
        this->pos = iVar13;
        iVar12 = iVar2;
      } while (iVar2 != lVar15);
    }
    else {
      bVar7 = false;
      iVar12 = iVar13;
    }
    iVar13 = iVar12 + 1;
    this->pos = iVar13;
    if ((((uint)pQVar10->wsm < 5) && ((0x1aU >> (pQVar10->wsm & 0x1f) & 1) != 0)) &&
       (((pQVar10->field_0x91 & 0xe) == 0 &&
        ((iVar13 < iVar2 + -1 && ((this->txt).d.ptr[iVar13] == L'\n')))))) {
      this->pos = iVar12 + 2;
    }
    if ((((ulong)(uint)pQVar10->id < 0x39) &&
        ((0x1000000e0000000U >> ((ulong)(uint)pQVar10->id & 0x3f) & 1) != 0)) || (bVar7)) {
      newNode(this,pQVar10->parent);
      iVar9 = QList<QTextHtmlParserNode_*>::end(&this->nodes);
      QTextHtmlParserNode::initializeProperties
                (iVar9.i[-1],(this->nodes).d.ptr[iVar9.i[-1]->parent],this);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
LAB_0051aba5:
  __stack_chk_fail();
}

Assistant:

void QTextHtmlParser::parseTag()
{
    eatSpace();

    // handle comments and other exclamation mark declarations
    if (hasPrefix(u'!')) {
        parseExclamationTag();
        if (nodes.last()->wsm != QTextHtmlParserNode::WhiteSpacePre
            && nodes.last()->wsm != QTextHtmlParserNode::WhiteSpacePreWrap
                && !textEditMode)
            eatSpace();
        return;
    }

    // if close tag just close
    if (hasPrefix(u'/')) {
        if (nodes.last()->id == Html_style) {
#ifndef QT_NO_CSSPARSER
            QCss::Parser parser(nodes.constLast()->text);
            QCss::StyleSheet sheet;
            sheet.origin = QCss::StyleSheetOrigin_Author;
            parser.parse(&sheet, Qt::CaseInsensitive);
            inlineStyleSheets.append(sheet);
            resolveStyleSheetImports(sheet);
#endif
        }
        parseCloseTag();
        return;
    }

    int p = last();
    while (p && at(p).tag.size() == 0)
        p = at(p).parent;

    QTextHtmlParserNode *node = newNode(p);

    // parse tag name
    node->tag = parseWord().toLower();

    const QTextHtmlElement *elem = lookupElementHelper(node->tag);
    if (elem) {
        node->id = elem->id;
        node->displayMode = elem->displayMode;
    } else {
        node->id = Html_unknown;
    }

    node->attributes.clear();
    // _need_ at least one space after the tag name, otherwise there can't be attributes
    if (pos < len && txt.at(pos).isSpace())
        node->attributes = parseAttributes();

    // resolveParent() may have to change the order in the tree and
    // insert intermediate nodes for buggy HTML, so re-initialize the 'node'
    // pointer through the return value
    node = resolveParent();
    resolveNode();

#ifndef QT_NO_CSSPARSER
    const int nodeIndex = nodes.size() - 1; // this new node is always the last
    node->applyCssDeclarations(declarationsForNode(nodeIndex), resourceProvider);
#endif
    applyAttributes(node->attributes);

    // finish tag
    bool tagClosed = false;
    while (pos < len && txt.at(pos) != u'>') {
        if (txt.at(pos) == u'/')
            tagClosed = true;

        pos++;
    }
    pos++;

    // in a white-space preserving environment strip off a initial newline
    // since the element itself already generates a newline
    if ((node->wsm == QTextHtmlParserNode::WhiteSpacePre
         || node->wsm == QTextHtmlParserNode::WhiteSpacePreWrap
         || node->wsm == QTextHtmlParserNode::WhiteSpacePreLine)
        && node->isBlock()) {
        if (pos < len - 1 && txt.at(pos) == u'\n')
            ++pos;
    }

    if (node->mayNotHaveChildren() || tagClosed) {
        newNode(node->parent);
        resolveNode();
    }
}